

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_2>,_tcu::Matrix<double,_2,_4>_>::call
          (unary<tcu::Matrix<double,_4,_2>,_tcu::Matrix<double,_2,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  GLdouble *data;
  bool bVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  uint uVar8;
  Matrix<double,_4,_2> result;
  Matrix<double,_2,_4> arg;
  long alStack_e8 [8];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_88 [8];
  long local_48 [8];
  
  alStack_e8[4] = 0x3ff0000000000000;
  alStack_e8[5] = 0;
  local_a8 = 0;
  uStack_a4 = 0;
  uStack_a0 = 0;
  uStack_9c = 0x3ff00000;
  alStack_e8[6] = 0;
  alStack_e8[7] = 0;
  local_98 = 0;
  uStack_90 = 0;
  lVar5 = 0;
  plVar6 = local_88;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar7 = 0;
    do {
      uVar8 = 0x3ff00000;
      if (lVar5 * 0x10 != lVar7) {
        uVar8 = 0;
      }
      *(ulong *)((long)plVar6 + lVar7) = (ulong)uVar8 << 0x20;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar5 = 1;
    plVar6 = local_88 + 1;
    bVar3 = false;
  } while (bVar4);
  local_88[0] = *argument_src;
  local_88[1] = *(undefined8 *)((long)argument_src + 8);
  local_88[2] = *(undefined8 *)((long)argument_src + 0x10);
  local_88[3] = *(undefined8 *)((long)argument_src + 0x18);
  local_88[4] = *(undefined8 *)((long)argument_src + 0x20);
  local_88[5] = *(undefined8 *)((long)argument_src + 0x28);
  local_88[6] = *(undefined8 *)((long)argument_src + 0x30);
  local_88[7] = *(undefined8 *)((long)argument_src + 0x38);
  alStack_e8[3] = 0x953700;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(local_88 + 8);
  lVar5 = 4;
  do {
    lVar7 = local_88[lVar5 + 5];
    lVar1 = local_88[lVar5 + 8];
    lVar2 = local_88[lVar5 + 9];
    alStack_e8[lVar5] = local_88[lVar5 + 4];
    alStack_e8[lVar5 + 1] = lVar7;
    alStack_e8[lVar5 + 4] = lVar1;
    alStack_e8[lVar5 + 5] = lVar2;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  *(long *)((long)result_dst + 0x10) = alStack_e8[6];
  *(long *)((long)result_dst + 0x18) = alStack_e8[7];
  *(long *)result_dst = alStack_e8[4];
  *(long *)((long)result_dst + 8) = alStack_e8[5];
  *(ulong *)((long)result_dst + 0x20) = CONCAT44(uStack_a4,local_a8);
  *(ulong *)((long)result_dst + 0x28) = CONCAT44(uStack_9c,uStack_a0);
  *(undefined8 *)((long)result_dst + 0x30) = local_98;
  *(undefined8 *)((long)result_dst + 0x38) = uStack_90;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}